

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O1

ze_result_t loader::zeSamplerDestroy(ze_sampler_handle_t hSampler)

{
  code *pcVar1;
  _ze_sampler_handle_t *_key;
  int iVar2;
  ze_result_t zVar3;
  pthread_mutex_t *__mutex;
  
  pcVar1 = *(code **)(*(long *)(hSampler + 8) + 0x5d0);
  if (pcVar1 == (code *)0x0) {
    zVar3 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    __mutex = (pthread_mutex_t *)(context + 0x1528);
    iVar2 = pthread_mutex_lock(__mutex);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    std::
    _Hashtable<object_t<_ze_sampler_handle_t_*>_*,_std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>,_std::allocator<std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>_>,_std::__detail::_Select1st,_std::equal_to<object_t<_ze_sampler_handle_t_*>_*>,_std::hash<object_t<_ze_sampler_handle_t_*>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase((_Hashtable<object_t<_ze_sampler_handle_t_*>_*,_std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>,_std::allocator<std::pair<object_t<_ze_sampler_handle_t_*>_*const,__ze_sampler_handle_t_*>_>,_std::__detail::_Select1st,_std::equal_to<object_t<_ze_sampler_handle_t_*>_*>,_std::hash<object_t<_ze_sampler_handle_t_*>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)(context + 0x1588));
    pthread_mutex_unlock(__mutex);
    _key = *(_ze_sampler_handle_t **)hSampler;
    zVar3 = (*pcVar1)(_key);
    if (zVar3 == ZE_RESULT_SUCCESS) {
      singleton_factory_t<object_t<_ze_sampler_handle_t_*>,__ze_sampler_handle_t_*>::release
                ((singleton_factory_t<object_t<_ze_sampler_handle_t_*>,__ze_sampler_handle_t_*> *)
                 (context + 0x780),_key);
      zVar3 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar3;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeSamplerDestroy(
        ze_sampler_handle_t hSampler                    ///< [in][release] handle of the sampler
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_sampler_object_t*>( hSampler )->dditable;
        auto pfnDestroy = dditable->ze.Sampler.pfnDestroy;
        if( nullptr == pfnDestroy )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // remove the handle from the kernel arugment map
        {
            std::lock_guard<std::mutex> lock(context->sampler_handle_map_lock);
            context->sampler_handle_map.erase(reinterpret_cast<ze_sampler_object_t*>(hSampler));
        }
        // convert loader handle to driver handle
        hSampler = reinterpret_cast<ze_sampler_object_t*>( hSampler )->handle;

        // forward to device-driver
        result = pfnDestroy( hSampler );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        // release loader handle
        context->ze_sampler_factory.release( hSampler );

        return result;
    }